

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callHeld(TestMoreStuffImpl *this,CallHeldContext context)

{
  int32_t value;
  _func_int **__n;
  void *__buf;
  int in_R8D;
  undefined1 local_e8 [120];
  Maybe<capnp::MessageSize> local_70;
  undefined1 local_58 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  TestMoreStuffImpl *this_local;
  CallHeldContext context_local;
  
  __n = context.hook[1]._vptr_CallContextHook;
  *(int *)__n = *(int *)__n + 1;
  request.hook.ptr = (RequestHook *)context.hook;
  context_local.hook = (CallContextHook *)this;
  kj::Maybe<capnp::MessageSize>::Maybe();
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_58,(Client *)(context.hook + 3),&local_70);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_70);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_58,0x7b);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setJ((Builder *)local_58,true);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  ::getParams((Reader *)(local_e8 + 0x30),
              (CallContext<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
               *)&this_local);
  value = capnproto_test::capnp::test::TestMoreStuff::CallHeldParams::Reader::getExpectedCallCount
                    ((Reader *)(local_e8 + 0x30));
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setExpectedCallCount
            ((Builder *)local_58,value);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_e8,(int)local_58,__buf,(size_t)__n,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>>::
  then<capnp::_::TestMoreStuffImpl::callHeld(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>)::__0>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>> *)
             this,(Type *)local_e8);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)local_e8);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_58);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callHeld(CallHeldContext context) {
  ++callCount;

  auto request = clientToHold.fooRequest();
  request.setI(123);
  request.setJ(true);
  request.setExpectedCallCount(context.getParams().getExpectedCallCount());

  return request.send().then(
      [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
        EXPECT_EQ("foo", response.getX());
        context.getResults().setS("bar");
      }